

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

DiagnosticStream * __thiscall
spvtools::val::ValidationState_t::diag
          (DiagnosticStream *__return_storage_ptr__,ValidationState_t *this,spv_result_t error_code,
          Instruction *inst)

{
  spv_const_context psVar1;
  spv_position_t position;
  spv_position_t position_00;
  spv_position_t position_01;
  uint uVar2;
  uint uVar3;
  allocator<char> local_289;
  undefined8 local_288;
  undefined8 uStack_280;
  size_t local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  size_t local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  size_t local_238;
  string local_228;
  string disassembly;
  
  if (error_code == SPV_WARNING) {
    uVar2 = this->num_of_warnings_;
    uVar3 = this->max_num_of_warnings_;
    if (uVar2 == uVar3) {
      local_238 = 0;
      local_248 = 0;
      uStack_240 = 0;
      psVar1 = this->context_;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_289);
      position.column = uStack_240;
      position.line = local_248;
      position.index = local_238;
      DiagnosticStream::DiagnosticStream
                ((DiagnosticStream *)&disassembly,position,&psVar1->consumer,&local_228,SPV_WARNING)
      ;
      std::operator<<((ostream *)&disassembly,"Other warnings have been suppressed.\n");
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&disassembly);
      std::__cxx11::string::_M_dispose();
      uVar2 = this->num_of_warnings_;
      uVar3 = this->max_num_of_warnings_;
    }
    if (uVar3 <= uVar2) {
      local_258 = 0;
      local_268 = 0;
      uStack_260 = 0;
      disassembly.field_2._M_allocated_capacity = 0;
      disassembly.field_2._8_8_ = 0;
      disassembly._M_dataplus._M_p = (pointer)0x0;
      disassembly._M_string_length = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_289);
      position_01.column = uStack_260;
      position_01.line = local_268;
      position_01.index = local_258;
      DiagnosticStream::DiagnosticStream
                (__return_storage_ptr__,position_01,(MessageConsumer *)&disassembly,&local_228,
                 SPV_WARNING);
      std::__cxx11::string::_M_dispose();
      if (disassembly.field_2._M_allocated_capacity == 0) {
        return __return_storage_ptr__;
      }
      (*(code *)disassembly.field_2._M_allocated_capacity)(&disassembly,&disassembly,3);
      return __return_storage_ptr__;
    }
    this->num_of_warnings_ = uVar2 + 1;
  }
  disassembly._M_dataplus._M_p = (pointer)&disassembly.field_2;
  disassembly._M_string_length = 0;
  disassembly.field_2._M_allocated_capacity =
       disassembly.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (inst == (Instruction *)0x0) {
    local_278 = 0;
  }
  else {
    Disassemble_abi_cxx11_(&local_228,this,inst);
    std::__cxx11::string::operator=((string *)&disassembly,(string *)&local_228);
    std::__cxx11::string::_M_dispose();
    local_278 = inst->line_num_;
  }
  local_288 = 0;
  uStack_280 = 0;
  position_00.index = local_278;
  position_00.line = 0;
  position_00.column = 0;
  DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position_00,&this->context_->consumer,&disassembly,error_code);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

DiagnosticStream ValidationState_t::diag(spv_result_t error_code,
                                         const Instruction* inst) {
  if (error_code == SPV_WARNING) {
    if (num_of_warnings_ == max_num_of_warnings_) {
      DiagnosticStream({0, 0, 0}, context_->consumer, "", error_code)
          << "Other warnings have been suppressed.\n";
    }
    if (num_of_warnings_ >= max_num_of_warnings_) {
      return DiagnosticStream({0, 0, 0}, nullptr, "", error_code);
    }
    ++num_of_warnings_;
  }

  std::string disassembly;
  if (inst) disassembly = Disassemble(*inst);

  return DiagnosticStream({0, 0, inst ? inst->LineNum() : 0},
                          context_->consumer, disassembly, error_code);
}